

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O3

void borg_parse(char *msg)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  wchar_t wVar6;
  long lVar7;
  
  if ((msg != (char *)0x0) && (*borg_cfg != 0)) {
    pcVar2 = format("# Parsing msg <%s>",msg);
    borg_note(pcVar2);
  }
  if (borg_parse::len != L'\0') {
    if ((msg != (char *)0x0) && (wVar6 = borg_parse::len, *msg == ' ')) goto LAB_00236614;
    iVar1 = 0;
    wVar6 = borg_parse::len;
    if (L'\x01' < borg_parse::len) {
      lVar5 = 0;
      lVar7 = 2;
      iVar1 = 0;
      do {
        if ((((ulong)(byte)borg_parse::buf[lVar5] < 0x40) &&
            ((0x8000400600000000U >> ((ulong)(byte)borg_parse::buf[lVar5] & 0x3f) & 1) != 0)) &&
           (borg_parse::buf[lVar5 + 1] == ' ')) {
          borg_parse::buf[lVar5 + 1] = '\0';
          borg_parse_aux(borg_parse::buf + iVar1,((int)lVar5 + 1) - iVar1);
          borg_parse::buf[lVar5 + 1] = ' ';
          lVar3 = lVar7;
          do {
            pcVar2 = borg_parse::buf + lVar3;
            lVar3 = lVar3 + 1;
          } while (*pcVar2 == ' ');
          iVar1 = (int)lVar3 + -1;
          wVar6 = borg_parse::len;
        }
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar5 < wVar6 + L'\xffffffff');
    }
    borg_parse_aux(borg_parse::buf + iVar1,wVar6 - iVar1);
    borg_parse::len = L'\0';
  }
  if (msg == (char *)0x0) {
    borg_parse::len = L'\0';
    return;
  }
  wVar6 = L'\0';
  if (*msg != ' ') {
    sVar4 = strnfmt(borg_parse::buf,0x400,"%s",msg);
    borg_parse::len = (wchar_t)sVar4;
    return;
  }
LAB_00236614:
  sVar4 = strnfmt(borg_parse::buf + wVar6,(long)(0x400 - wVar6),"%s",msg);
  borg_parse::len = (int)sVar4 + borg_parse::len;
  return;
}

Assistant:

void borg_parse(char *msg)
{
    static int  len = 0;
    static char buf[1024];

    /* Note the long message */
    if (borg_cfg[BORG_VERBOSE] && msg)
        borg_note(format("# Parsing msg <%s>", msg));

    /* Flush messages */
    if (len && (!msg || (msg[0] != ' '))) {
        int i, j;

        /* Split out punctuation */
        for (j = i = 0; i < len - 1; i++) {
            /* Check for punctuation */
            if ((buf[i] == '.') || (buf[i] == '!') || (buf[i] == '?')
                || (buf[i] == '"')) {
                /* Require space */
                if (buf[i + 1] == ' ') {
                    /* Terminate */
                    buf[i + 1] = '\0';

                    /* Parse fragment */
                    borg_parse_aux(buf + j, (i + 1) - j);

                    /* Restore */
                    buf[i + 1] = ' ';

                    /* Advance past spaces */
                    for (j = i + 2; buf[j] == ' '; j++) /* loop */
                        ;
                }
            }
        }

        /* Parse tail */
        borg_parse_aux(buf + j, len - j);

        /* Forget */
        len = 0;
    }

    /* No message */
    if (!msg) {
        /* Start over */
        len = 0;
    }

    /* Continued message */
    else if (msg[0] == ' ') {
        /* Collect, verify, and grow */
        len += strnfmt(buf + len, 1024 - len, "%s", msg);
    }

    /* New message */
    else {
        /* Collect, verify, and grow */
        len = strnfmt(buf, 1024, "%s", msg);
    }
}